

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O3

shared_ptr<QPDFFileSpecObjectHelper> __thiscall
QPDFEmbeddedFileDocumentHelper::getEmbeddedFile(QPDFEmbeddedFileDocumentHelper *this,string *name)

{
  bool bVar1;
  pointer pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  string *extraout_RDX;
  shared_ptr<QPDFFileSpecObjectHelper> sVar3;
  iterator i;
  undefined1 local_a9;
  iterator local_a8;
  iterator local_60;
  
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper = (_func_int **)0x0;
  (this->super_QPDFDocumentHelper).qpdf = (QPDF *)0x0;
  if ((QPDFNameTreeObjectHelper *)**(undefined8 **)&name->field_2 != (QPDFNameTreeObjectHelper *)0x0
     ) {
    QPDFNameTreeObjectHelper::find
              (&local_60,(QPDFNameTreeObjectHelper *)**(undefined8 **)&name->field_2,
               (string *)in_RDX._M_pi,false);
    QPDFNameTreeObjectHelper::end
              (&local_a8,(QPDFNameTreeObjectHelper *)**(undefined8 **)&name->field_2);
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_60,&local_a8);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_a8);
    if (!bVar1) {
      pTVar2 = QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_(&local_60);
      local_a8._vptr_iterator = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFFileSpecObjectHelper,std::allocator<QPDFFileSpecObjectHelper>,QPDFObjectHandle&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.impl,
                 (QPDFFileSpecObjectHelper **)&local_a8,
                 (allocator<QPDFFileSpecObjectHelper> *)&local_a9,&pTVar2->second);
      (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper = local_a8._vptr_iterator;
      (this->super_QPDFDocumentHelper).qpdf =
           (QPDF *)local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_60);
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  sVar3.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFFileSpecObjectHelper>)
         sVar3.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFFileSpecObjectHelper>
QPDFEmbeddedFileDocumentHelper::getEmbeddedFile(std::string const& name)
{
    std::shared_ptr<QPDFFileSpecObjectHelper> result;
    if (m->embedded_files) {
        auto i = m->embedded_files->find(name);
        if (i != m->embedded_files->end()) {
            result = std::make_shared<QPDFFileSpecObjectHelper>(i->second);
        }
    }
    return result;
}